

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O3

FT_Error tt_glyph_load(FT_GlyphSlot ttslot,FT_Size ttsize,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Outline *outline;
  byte *pbVar1;
  int *piVar2;
  undefined8 *puVar3;
  FT_Bool FVar4;
  ushort uVar5;
  TT_Face face;
  FT_Fixed FVar6;
  ulong uVar7;
  TT_Face pTVar8;
  FT_Driver pFVar9;
  long lVar10;
  FT_CharMap pFVar11;
  FT_GlyphLoader loader;
  FT_Vector *pFVar12;
  short *psVar13;
  FT_Pos FVar14;
  FT_Fixed FVar15;
  FT_UShort FVar16;
  FT_F2Dot14 FVar17;
  undefined4 uVar18;
  short sVar19;
  short sVar20;
  byte bVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  TT_ExecContext pTVar26;
  FT_Face pFVar27;
  FT_Generic_Finalizer p_Var28;
  FT_Pointer pvVar29;
  long lVar30;
  TT_GlyphZone zone;
  FT_CharMap pFVar31;
  undefined4 in_register_00000014;
  FT_Bool FVar32;
  FT_Stream pFVar33;
  undefined8 uVar34;
  FT_UShort FVar35;
  long lVar36;
  TT_GraphicsState *pTVar37;
  FT_BBox *pFVar38;
  TT_GraphicsState *pTVar39;
  FT_Size_Internal *ppFVar40;
  FT_Pos *pFVar41;
  byte bVar42;
  ulong uVar43;
  bool bVar44;
  byte bVar45;
  TT_GlyphSlot slot;
  FT_Short top_bearing;
  FT_UShort advance_width;
  FT_UShort advance_height;
  FT_Short left_bearing;
  uint local_1f8;
  ushort local_1f2;
  undefined8 local_1f0;
  ulong local_1e8;
  FT_UShort local_1da;
  TT_Face local_1d8;
  TT_ExecContext local_1d0;
  undefined8 local_1c8;
  FT_Driver local_1c0;
  FT_Stream local_1b8;
  TT_LoaderRec_ local_1b0;
  
  uVar43 = CONCAT44(in_register_00000014,glyph_index);
  bVar45 = 0;
  if (ttsize == (FT_Size)0x0) {
    return 0x24;
  }
  face = (TT_Face)ttslot->face;
  if (face == (TT_Face)0x0) {
    return 0x23;
  }
  if (((uint)(face->root).num_glyphs <= glyph_index) &&
     (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0)) {
    return 6;
  }
  if ((load_flags & 2U) != 0) {
    uVar25 = (ulong)(load_flags & 0xfffffffd);
    if (((face->root).face_flags & 0x2000) == 0) {
      uVar25 = (ulong)(uint)load_flags;
    }
    load_flags = (uint)(uVar25 >> 0xe) & 2 | (uint)uVar25;
  }
  if ((load_flags & 0x401U) != 0) {
    load_flags = (uint)(((face->root).face_flags & 0x2000) == 0) * 2 | load_flags | 9;
  }
  pFVar27 = (FT_Face)&ttsize->metrics;
  if ((load_flags & 2U) == 0) {
    pFVar27 = (FT_Face)&ttsize[1].generic;
  }
  ttsize[1].face = pFVar27;
  lVar30 = ttsize[2].metrics.height;
  uVar25 = (ulong)load_flags;
  local_1b0.glyph = ttslot;
  if ((((char)((load_flags & 8U) >> 3) == '\0' && lVar30 != 0xffffffff) &&
      (((face->root).face_index & 0x7fff0000) == 0)) && (((face->root).face_flags & 0x8000) == 0)) {
    local_1e8 = (ttsize->metrics).x_scale;
    FVar6 = (ttsize->metrics).y_scale;
    local_1f0 = uVar25;
    uVar22 = (**(code **)((long)face->sfnt + 0x90))
                       (face,lVar30,uVar43,load_flags,(face->root).stream,&ttslot->bitmap,&local_1b0
                       );
    iVar23 = (int)FVar6;
    if (uVar22 == 0) {
      (ttslot->outline).n_contours = 0;
      (ttslot->outline).n_points = 0;
      (ttslot->metrics).width = ((ulong)local_1b0.face >> 0x10 & 0xffff) << 6;
      (ttslot->metrics).height = ((ulong)local_1b0.face & 0xffff) << 6;
      (ttslot->metrics).horiBearingX = (long)local_1b0.face._4_2_ << 6;
      (ttslot->metrics).horiBearingY = (long)local_1b0.face._6_2_ << 6;
      (ttslot->metrics).horiAdvance = ((ulong)local_1b0.size & 0xffff) << 6;
      (ttslot->metrics).vertBearingX = (long)local_1b0.size._2_2_ << 6;
      (ttslot->metrics).vertBearingY = (long)local_1b0.size._4_2_ << 6;
      (ttslot->metrics).vertAdvance = ((ulong)local_1b0.size >> 0x30) << 6;
      bVar44 = (load_flags & 0x10U) == 0;
      if (bVar44) {
        local_1b0.size._2_2_ = local_1b0.face._4_2_;
      }
      ttslot->format = FT_GLYPH_FORMAT_BITMAP;
      if (bVar44) {
        local_1b0.size._4_2_ = local_1b0.face._6_2_;
      }
      ttslot->bitmap_left = (int)local_1b0.size._2_2_;
      ttslot->bitmap_top = (int)local_1b0.size._4_2_;
      pTVar8 = (TT_Face)ttslot->face;
      if (((pTVar8->root).face_flags & 0x20001) == 0) {
        return 0;
      }
      local_1d8 = (TT_Face)(pTVar8->root).stream;
      memset(&local_1b0.gloader,0,0x168);
      local_1b0.load_flags = local_1f0;
      local_1b0.stream = (FT_Stream)local_1d8;
      local_1b0.composites.head = (FT_ListNode)0x0;
      local_1b0.composites.tail = (FT_ListNode)0x0;
      local_1b0.face = pTVar8;
      local_1b0.size = (TT_Size)ttsize;
      load_truetype_glyph(&local_1b0,glyph_index,0,'\x01');
      FT_List_Finalize(&local_1b0.composites,(FT_List_Destructor)0x0,((local_1b0.face)->root).memory
                       ,(void *)0x0);
      ttslot->linearHoriAdvance = (long)local_1b0.linear;
      ttslot->linearVertAdvance = (long)local_1b0.vadvance;
      if ((face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) && (0 < local_1b0.n_contours)) {
        bVar44 = (local_1f0 & 0x10) != 0;
        pFVar38 = (FT_BBox *)&local_1b0.left_bearing;
        if (bVar44) {
          pFVar38 = &local_1b0.bbox;
        }
        pFVar41 = &local_1b0.bbox.yMin;
        if (bVar44) {
          pFVar41 = (FT_Pos *)&local_1b0.top_bearing;
        }
        FVar14 = *pFVar41;
        lVar30 = (long)(int)(FT_UInt)local_1e8 * (long)(int)pFVar38->xMin;
        ttslot->bitmap_left =
             ttslot->bitmap_left + ((int)((ulong)(lVar30 + 0x8000 + (lVar30 >> 0x3f)) >> 0x10) >> 6)
        ;
        lVar30 = (long)iVar23 * (long)(int)FVar14;
        ttslot->bitmap_top =
             ttslot->bitmap_top + ((int)((ulong)(lVar30 + 0x8000 + (lVar30 >> 0x3f)) >> 0x10) >> 6);
      }
      if (((ttslot->metrics).horiAdvance == 0) && (local_1b0.linear != 0)) {
        lVar30 = (long)(int)(FT_UInt)local_1e8 * (long)local_1b0.linear;
        (ttslot->metrics).horiAdvance =
             (long)(int)((ulong)((lVar30 >> 0x3f) + lVar30 + 0x8000) >> 0x10);
      }
      if ((ttslot->metrics).vertAdvance == 0) {
        if (local_1b0.vadvance != 0) {
          lVar30 = (long)iVar23 * (long)local_1b0.vadvance;
          (ttslot->metrics).vertAdvance =
               (long)(int)((ulong)((lVar30 >> 0x3f) + lVar30 + 0x8000) >> 0x10);
          return 0;
        }
        return 0;
      }
      return 0;
    }
    uVar7 = ttslot->face->face_flags;
    uVar25 = local_1f0;
    if ((char)uVar22 == -99) {
      uVar43 = (ulong)glyph_index;
      if ((uVar7 & 1) == 0) {
        local_1b0.face = (TT_Face)((ulong)local_1b0.face & 0xffffffffffff0000);
        local_1f8 = local_1f8 & 0xffff0000;
        local_1f2 = 0;
        local_1da = 0;
        if (face->horz_metrics_size != 0) {
          (**(code **)((long)face->sfnt + 0x140))(face,0,uVar43,&local_1b0,&local_1f2);
          TT_Get_VMetrics(face,glyph_index,0,(FT_Short *)&local_1f8,&local_1da);
          (ttslot->outline).n_contours = 0;
          (ttslot->outline).n_points = 0;
          (ttslot->metrics).width = 0;
          (ttslot->metrics).height = 0;
          lVar30 = (long)(short)local_1b0.face * (long)(int)(FT_UInt)local_1e8;
          (ttslot->metrics).horiBearingX = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
          (ttslot->metrics).horiBearingY = 0;
          lVar30 = (ulong)local_1f2 * (long)(int)(FT_UInt)local_1e8;
          (ttslot->metrics).horiAdvance = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
          (ttslot->metrics).vertBearingX = 0;
          lVar30 = (long)(short)local_1f8 * (long)iVar23;
          (ttslot->metrics).vertBearingY = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
          lVar30 = (ulong)local_1da * (long)iVar23;
          (ttslot->metrics).vertAdvance = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
          ttslot->format = FT_GLYPH_FORMAT_BITMAP;
          (ttslot->bitmap).pixel_mode = '\x01';
          ttslot->bitmap_left = 0;
          ttslot->bitmap_top = 0;
          return 0;
        }
        return uVar22;
      }
    }
    else {
      uVar43 = (ulong)glyph_index;
      if ((uVar7 & 1) == 0) {
        return uVar22;
      }
    }
  }
  if (((uint)load_flags >> 0xe & 1) != 0) {
    return 6;
  }
  if (((uVar25 & 1) == 0) && ((char)ttsize[2].metrics.ascender == '\0')) {
    return 0x24;
  }
  if ((((uint)load_flags >> 0x14 & 1) != 0) && (face->svg != (void *)0x0)) {
    local_1d8 = (TT_Face)face->sfnt;
    iVar23 = (**(code **)((long)local_1d8 + 0x168))(ttslot);
    pTVar8 = local_1d8;
    if (iVar23 == 0) {
      FVar6 = (ttsize->metrics).x_scale;
      FVar15 = (ttsize->metrics).y_scale;
      ttslot->format = FT_GLYPH_FORMAT_SVG;
      local_1e8 = CONCAT44(local_1e8._4_4_,(int)uVar43);
      (**(code **)((long)local_1d8 + 0x140))(face,0,uVar43 & 0xffffffff,&local_1b0,&local_1f2);
      (**(code **)((long)pTVar8 + 0x140))(face,1,local_1e8 & 0xffffffff,&local_1f8);
      ttslot->linearHoriAdvance = (ulong)local_1f2;
      ttslot->linearVertAdvance = (ulong)local_1da;
      lVar30 = (long)(int)FVar6 * (ulong)local_1f2;
      (ttslot->metrics).horiAdvance = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
      lVar30 = (long)(int)FVar15 * (ulong)local_1da;
      (ttslot->metrics).vertAdvance = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
      return 0;
    }
  }
  if (((uint)load_flags >> 0x17 & 1) != 0) {
    return 6;
  }
  local_1e8 = CONCAT44(local_1e8._4_4_,(int)uVar43);
  local_1d8 = (TT_Face)ttslot->face;
  pFVar9 = (local_1d8->root).driver;
  pFVar33 = (local_1d8->root).stream;
  memset(&local_1b0,0,0x180);
  uVar43 = uVar25;
  local_1b8 = pFVar33;
  if ((uVar25 & 2) == 0) {
    bVar42 = (byte)uVar25 >> 7;
    uVar22 = *(uint *)&ttsize[6].generic.finalizer;
    local_1c0 = pFVar9;
    if ((int)uVar22 < 0) {
      pFVar27 = ttsize->face;
      pFVar33 = (FT_Stream)pFVar27->memory;
      local_1f0 = uVar25;
      ft_mem_free((FT_Memory)pFVar33,ttsize[3].face);
      ttsize[3].face = (FT_Face)0x0;
      ft_mem_free((FT_Memory)pFVar33,ttsize[3].generic.finalizer);
      ttsize[3].generic.finalizer = (FT_Generic_Finalizer)0x0;
      ft_mem_free((FT_Memory)pFVar33,ttsize[5].generic.data);
      ttsize[5].generic.data = (void *)0x0;
      ft_mem_free((FT_Memory)pFVar33,*(void **)&ttsize[5].metrics);
      ttsize[5].metrics.x_ppem = 0;
      ttsize[5].metrics.y_ppem = 0;
      *(undefined4 *)&ttsize[5].metrics.field_0x4 = 0;
      pTVar26 = (TT_ExecContext)ttsize[6].generic.data;
      if (pTVar26 != (TT_ExecContext)0x0) {
        TT_Done_Context(pTVar26);
      }
      local_1d0 = (TT_ExecContext)&ttsize[5].metrics.x_scale;
      tt_glyphzone_done((TT_GlyphZone)local_1d0);
      ttsize[6].generic.finalizer = (FT_Generic_Finalizer)0xffffffffffffffff;
      pTVar26 = TT_New_Context((TT_Driver)pFVar27->driver);
      ttsize[6].generic.data = pTVar26;
      uVar5 = *(ushort *)&pFVar27[1].extensions;
      *(uint *)((long)&ttsize[2].internal + 4) = (uint)uVar5;
      *(uint *)((long)&ttsize[3].generic.data + 4) =
           (uint)*(ushort *)((long)&pFVar27[1].extensions + 2);
      *(undefined4 *)&ttsize[2].internal = 0;
      *(undefined4 *)&ttsize[3].generic.data = 0;
      ttsize[3].metrics.x_ppem = 0;
      ttsize[3].metrics.y_ppem = 0;
      *(undefined4 *)&ttsize[3].metrics.field_0x4 = 0;
      ttsize[5].face = (FT_Face)pFVar27[4].glyph;
      *(undefined2 *)&ttsize[5].generic.finalizer =
           *(undefined2 *)((long)&pFVar27[1].autohint.finalizer + 6);
      *(undefined2 *)((long)&ttsize[2].metrics.ascender + 1) = 0;
      ttsize[2].metrics.x_scale = 0;
      ttsize[2].metrics.y_scale = 0;
      ttsize[2].generic.finalizer = (FT_Generic_Finalizer)0x0;
      ttsize[2].metrics.x_ppem = 0;
      ttsize[2].metrics.y_ppem = 0;
      *(undefined4 *)&ttsize[2].metrics.field_0x4 = 0;
      local_1c8 = pFVar27;
      pFVar27 = (FT_Face)ft_mem_realloc((FT_Memory)pFVar33,0x28,0,(ulong)uVar5,(void *)0x0,
                                        (FT_Error *)&local_1f8);
      ttsize[3].face = pFVar27;
      if (local_1f8 == 0) {
        p_Var28 = (FT_Generic_Finalizer)
                  ft_mem_realloc((FT_Memory)pFVar33,0x28,0,
                                 (ulong)*(uint *)((long)&ttsize[3].generic.data + 4),(void *)0x0,
                                 (FT_Error *)&local_1f8);
        ttsize[3].generic.finalizer = p_Var28;
        if (local_1f8 == 0) {
          pvVar29 = ft_mem_realloc((FT_Memory)pFVar33,8,0,(FT_Long)ttsize[5].face,(void *)0x0,
                                   (FT_Error *)&local_1f8);
          ttsize[5].generic.data = pvVar29;
          if (local_1f8 == 0) {
            zone = (TT_GlyphZone)(ulong)*(ushort *)&ttsize[5].generic.finalizer;
            pvVar29 = ft_mem_realloc((FT_Memory)pFVar33,8,0,(FT_Long)zone,(void *)0x0,
                                     (FT_Error *)&local_1f8);
            *(FT_Pointer *)&ttsize[5].metrics = pvVar29;
            if (local_1f8 == 0) {
              FVar35 = (short)*(undefined4 *)((long)&local_1c8[1].autohint.finalizer + 4) + 4;
              local_1f8 = tt_glyphzone_new((FT_Memory)pFVar33,FVar35,(FT_Short)local_1d0,zone);
              if (local_1f8 == 0) {
                *(FT_UShort *)((long)&ttsize[5].metrics.y_scale + 4) = FVar35;
                pTVar37 = &tt_default_graphics_state;
                ppFVar40 = &ttsize[3].internal;
                for (lVar30 = 0xc; lVar30 != 0; lVar30 = lVar30 + -1) {
                  *ppFVar40 = *(FT_Size_Internal *)pTVar37;
                  pTVar37 = (TT_GraphicsState *)((long)pTVar37 + ((ulong)bVar45 * -2 + 1) * 8);
                  ppFVar40 = ppFVar40 + (ulong)bVar45 * -2 + 1;
                }
                pFVar11 = (FT_CharMap)((local_1c8->driver->root).library)->debug_hooks[0];
                pFVar31 = (FT_CharMap)TT_RunIns;
                if (pFVar11 != (FT_CharMap)0x0) {
                  pFVar31 = pFVar11;
                }
                local_1c8[4].charmap = pFVar31;
                uVar22 = tt_size_run_fpgm((TT_Size)ttsize,bVar42);
                uVar25 = local_1f0;
                goto LAB_0024ecb4;
              }
            }
          }
        }
      }
      tt_size_done_bytecode(ttsize);
      uVar25 = local_1f0;
      uVar22 = local_1f8;
LAB_0024ecb4:
      if (uVar22 != 0) {
        return uVar22;
      }
      uVar24 = *(uint *)((long)&ttsize[6].generic.finalizer + 4);
      if ((int)uVar24 < 0) {
        uVar5 = *(ushort *)((long)&ttsize[5].metrics.y_scale + 4);
        if (uVar5 != 0) {
          lVar30 = ttsize[5].metrics.ascender;
          lVar10 = ttsize[5].metrics.descender;
          lVar36 = 0;
          do {
            puVar3 = (undefined8 *)(lVar30 + lVar36);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)(lVar10 + lVar36);
            *puVar3 = 0;
            puVar3[1] = 0;
            lVar36 = lVar36 + 0x10;
          } while ((ulong)uVar5 * 0x10 != lVar36);
        }
        uVar5 = *(ushort *)&ttsize[5].generic.finalizer;
        if (uVar5 != 0) {
          memset(*(void **)&ttsize[5].metrics,0,(ulong)uVar5 << 3);
        }
        pTVar37 = &tt_default_graphics_state;
        ppFVar40 = &ttsize[3].internal;
        for (lVar30 = 0xc; lVar30 != 0; lVar30 = lVar30 + -1) {
          *ppFVar40 = *(FT_Size_Internal *)pTVar37;
          pTVar37 = (TT_GraphicsState *)((long)pTVar37 + ((ulong)bVar45 * -2 + 1) * 8);
          ppFVar40 = ppFVar40 + (ulong)bVar45 * -2 + 1;
        }
        uVar24 = tt_size_run_prep((TT_Size)ttsize,bVar42);
      }
    }
    else {
      uVar24 = *(uint *)((long)&ttsize[6].generic.finalizer + 4);
      if ((int)uVar24 < 0) goto LAB_0024ecb4;
      if (uVar22 != 0) {
        return uVar22;
      }
    }
    if (uVar24 != 0) {
      return uVar24;
    }
    pTVar26 = (TT_ExecContext)ttsize[6].generic.data;
    if (pTVar26 == (TT_ExecContext)0x0) {
      return 0x99;
    }
    uVar34 = CONCAT71((int7)((ulong)pFVar33 >> 8),(load_flags & 0xf0000U) != 0x20000);
    local_1c8._4_4_ = (uint)((ulong)local_1c8 >> 0x20);
    local_1f0._4_4_ = (uint)(local_1f0 >> 0x20);
    if (*(int *)&local_1c0[2].root.library == 0x28) {
      local_1c8 = (FT_Face)CONCAT44(local_1c8._4_4_,
                                    (int)CONCAT71((int7)((ulong)local_1c0 >> 8),
                                                  (load_flags & 0x70000U) == 0 &&
                                                  (load_flags & 0xf0000U) != 0x20000));
      bVar21 = (byte)((uint)load_flags >> 0x12) & 1;
      local_1f0 = CONCAT44(local_1f0._4_4_,(int)uVar34);
      uVar34 = 0;
    }
    else {
      bVar21 = 0;
      local_1c8 = (FT_Face)((ulong)local_1c8._4_4_ << 0x20);
      local_1f0 = (ulong)local_1f0._4_4_ << 0x20;
    }
    pTVar26->vertical_lcd_lean = bVar21;
    uVar22 = TT_Load_Context(pTVar26,local_1d8,(TT_Size)ttsize);
    if (uVar22 != 0) {
      return uVar22;
    }
    FVar32 = (FT_Bool)uVar34;
    local_1d0 = pTVar26;
    if (*(int *)&local_1c0[2].root.library == 0x28) {
      FVar4 = pTVar26->subpixel_hinting_lean;
      if ((FT_Bool)local_1f0 != FVar4) {
        pTVar26->subpixel_hinting_lean = (FT_Bool)local_1f0;
      }
      if ((FT_Bool)local_1c8 == pTVar26->grayscale_cleartype) {
        if (pTVar26->grayscale == FVar32) {
          if ((FT_Bool)local_1f0 == FVar4) goto LAB_0024eea6;
        }
        else {
LAB_0024ee74:
          pTVar26->grayscale = FVar32;
        }
      }
      else {
        pTVar26->grayscale_cleartype = (FT_Bool)local_1c8;
        if (pTVar26->grayscale != FVar32) goto LAB_0024ee74;
      }
      uVar22 = tt_size_run_prep((TT_Size)ttsize,bVar42);
      pTVar26 = local_1d0;
      if (uVar22 != 0) {
        return uVar22;
      }
      uVar22 = TT_Load_Context(local_1d0,local_1d8,(TT_Size)ttsize);
      if (uVar22 != 0) {
        return uVar22;
      }
    }
    else if (pTVar26->grayscale != FVar32) goto LAB_0024ee74;
LAB_0024eea6:
    uVar22 = *(uint *)&(pTVar26->GS).instruct_control;
    bVar42 = (byte)uVar22;
    if ((uVar22 & 2) != 0) {
      pTVar37 = &tt_default_graphics_state;
      pTVar39 = &pTVar26->GS;
      for (lVar30 = 0xc; lVar30 != 0; lVar30 = lVar30 + -1) {
        FVar35 = pTVar37->rp1;
        FVar16 = pTVar37->rp2;
        FVar17 = (pTVar37->dualVector).x;
        pTVar39->rp0 = pTVar37->rp0;
        pTVar39->rp1 = FVar35;
        pTVar39->rp2 = FVar16;
        (pTVar39->dualVector).x = FVar17;
        pTVar37 = (TT_GraphicsState *)((long)pTVar37 + ((ulong)bVar45 * -2 + 1) * 8);
        pTVar39 = (TT_GraphicsState *)((long)pTVar39 + (ulong)bVar45 * -0x10 + 8);
      }
      bVar42 = 0;
    }
    iVar23 = *(int *)&local_1c0[2].root.library;
    if ((((FT_Bool)local_1f0 == '\0') || (iVar23 != 0x28)) ||
       ((ttslot->face->face_flags & 0x2000) != 0)) {
      pTVar26->backward_compatibility = '\0';
      bVar45 = 1;
    }
    else {
      bVar45 = bVar42 >> 2 & 1;
      pTVar26->backward_compatibility = bVar45 ^ 1;
    }
    pTVar26->pedantic_hinting = (byte)((uVar25 & 0xffffffff) >> 7) & 1;
    local_1b0.instructions = pTVar26->glyphIns;
    local_1b0.widthp = (FT_Byte *)0x0;
    if (((iVar23 != 0x28 | bVar45) == 1) && ((local_1b0.load_flags & 0x200002) == 0)) {
      if ((local_1d8->postscript).isFixedPitch == 0) {
        local_1b0.widthp = (FT_Byte *)ttsize[2].metrics.descender;
      }
      else {
        local_1b0.widthp = (FT_Byte *)0x0;
      }
    }
    uVar43 = (ulong)(int)(uVar22 * 2 & 2 | load_flags);
    local_1b0.exec = pTVar26;
  }
  loader = ttslot->internal->loader;
  FT_GlyphLoader_Rewind(loader);
  local_1b0.face = local_1d8;
  local_1b0.stream = local_1b8;
  local_1b0.composites.head = (FT_ListNode)0x0;
  local_1b0.composites.tail = (FT_ListNode)0x0;
  local_1b0.gloader = loader;
  local_1b0.load_flags = uVar43;
  if ((((uint)load_flags >> 8 & 1) != 0) &&
     (local_1b0.widthp != (FT_Byte *)0x0 && (uVar25 & 0x10) == 0)) {
    (ttslot->metrics).horiAdvance = (ulong)local_1b0.widthp[local_1e8 & 0xffffffff] << 6;
    uVar22 = 0;
    local_1b0.size = (TT_Size)ttsize;
    goto LAB_0024f1c2;
  }
  ttslot->format = FT_GLYPH_FORMAT_OUTLINE;
  ttslot->num_subglyphs = 0;
  (ttslot->outline).flags = 0;
  local_1b0.size = (TT_Size)ttsize;
  uVar22 = load_truetype_glyph(&local_1b0,(FT_UInt)local_1e8,0,'\0');
  if (uVar22 == 0) {
    if (ttslot->format == FT_GLYPH_FORMAT_COMPOSITE) {
      ttslot->num_subglyphs = ((local_1b0.gloader)->base).num_subglyphs;
      ttslot->subglyphs = ((local_1b0.gloader)->base).subglyphs;
LAB_0024f13a:
    }
    else {
      outline = &ttslot->outline;
      uVar18 = *(undefined4 *)&((local_1b0.gloader)->base).outline.field_0x24;
      (ttslot->outline).flags = ((local_1b0.gloader)->base).outline.flags;
      *(undefined4 *)&(ttslot->outline).field_0x24 = uVar18;
      sVar19 = ((local_1b0.gloader)->base).outline.n_contours;
      sVar20 = ((local_1b0.gloader)->base).outline.n_points;
      uVar18 = *(undefined4 *)&((local_1b0.gloader)->base).outline.field_0x4;
      pFVar12 = ((local_1b0.gloader)->base).outline.points;
      psVar13 = ((local_1b0.gloader)->base).outline.contours;
      (ttslot->outline).tags = ((local_1b0.gloader)->base).outline.tags;
      (ttslot->outline).contours = psVar13;
      outline->n_contours = sVar19;
      outline->n_points = sVar20;
      *(undefined4 *)&outline->field_0x4 = uVar18;
      (ttslot->outline).points = pFVar12;
      pbVar1 = (byte *)((long)&(ttslot->outline).flags + 1);
      *pbVar1 = *pbVar1 & 0xfd;
      if (local_1b0.pp1.x != 0) {
        FT_Outline_Translate(outline,-local_1b0.pp1.x,0);
        goto LAB_0024f13a;
      }
    }
    if ((uVar25 & 2) == 0) {
      uVar22 = 8;
      if (((local_1b0.exec)->GS).scan_control != '\0') {
        switch(((local_1b0.exec)->GS).scan_type) {
        case 0:
          uVar22 = 0x20;
          break;
        case 1:
          goto switchD_0024f175_caseD_1;
        case 4:
          uVar22 = 0x30;
          break;
        case 5:
          uVar22 = 0x10;
        }
      }
      piVar2 = &(ttslot->outline).flags;
      *piVar2 = *piVar2 | uVar22;
    }
switchD_0024f175_caseD_1:
    uVar22 = compute_glyph_metrics(&local_1b0,(FT_UInt)local_1e8);
  }
  if (((uVar25 & 1) == 0) && (*(ushort *)((long)&(ttsize[1].face)->num_faces + 2) < 0x18)) {
    pbVar1 = (byte *)((long)&(ttslot->outline).flags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
LAB_0024f1c2:
  FT_List_Finalize(&local_1b0.composites,(FT_List_Destructor)0x0,((local_1b0.face)->root).memory,
                   (void *)0x0);
  return uVar22;
}

Assistant:

static FT_Error
  tt_glyph_load( FT_GlyphSlot  ttslot,      /* TT_GlyphSlot */
                 FT_Size       ttsize,      /* TT_Size      */
                 FT_UInt       glyph_index,
                 FT_Int32      load_flags )
  {
    TT_GlyphSlot  slot = (TT_GlyphSlot)ttslot;
    TT_Size       size = (TT_Size)ttsize;
    FT_Face       face = ttslot->face;
    FT_Error      error;


    if ( !slot )
      return FT_THROW( Invalid_Slot_Handle );

    if ( !size )
      return FT_THROW( Invalid_Size_Handle );

    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    if ( glyph_index >= (FT_UInt)face->num_glyphs &&
         !face->internal->incremental_interface   )
#else
    if ( glyph_index >= (FT_UInt)face->num_glyphs )
#endif
      return FT_THROW( Invalid_Argument );

    if ( load_flags & FT_LOAD_NO_HINTING )
    {
      /* both FT_LOAD_NO_HINTING and FT_LOAD_NO_AUTOHINT   */
      /* are necessary to disable hinting for tricky fonts */

      if ( FT_IS_TRICKY( face ) )
        load_flags &= ~FT_LOAD_NO_HINTING;

      if ( load_flags & FT_LOAD_NO_AUTOHINT )
        load_flags |= FT_LOAD_NO_HINTING;
    }

    if ( load_flags & ( FT_LOAD_NO_RECURSE | FT_LOAD_NO_SCALE ) )
    {
      load_flags |= FT_LOAD_NO_BITMAP | FT_LOAD_NO_SCALE;

      if ( !FT_IS_TRICKY( face ) )
        load_flags |= FT_LOAD_NO_HINTING;
    }

    /* use hinted metrics only if we load a glyph with hinting */
    size->metrics = ( load_flags & FT_LOAD_NO_HINTING )
                      ? &ttsize->metrics
                      : &size->hinted_metrics;

    /* now fill in the glyph slot with outline/bitmap/layered */
    error = TT_Load_Glyph( size, slot, glyph_index, load_flags );

    /* force drop-out mode to 2 - irrelevant now */
    /* slot->outline.dropout_mode = 2; */

    return error;
  }